

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Vec_Ptr_t * Saig_ManWindowOutline(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist)

{
  int *pDists;
  Vec_Ptr_t *vNodes;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  int i;
  
  pDists = (int *)calloc((long)p->vObjs->nSize,4);
  vNodes = Vec_PtrAlloc(1000);
  Aig_ManIncrementTravId(p);
  Saig_ManWindowOutline_rec(p,pObj,nDist,vNodes,pDists);
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Aig_ObjCompareIdIncrease);
  }
  i = 0;
  do {
    if (p->nRegs <= i) {
      free(pDists);
      return vNodes;
    }
    pAVar1 = Saig_ManLi(p,i);
    pAVar2 = Saig_ManLo(p,i);
    i = i + 1;
  } while ((pAVar2->TravId != p->nTravIds) != (pAVar1->TravId == p->nTravIds));
  __assert_fail("Aig_ObjIsTravIdCurrent(p, pObjLi) == Aig_ObjIsTravIdCurrent(p, pObjLo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                ,0x71,"Vec_Ptr_t *Saig_ManWindowOutline(Aig_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

Vec_Ptr_t * Saig_ManWindowOutline( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObjLi, * pObjLo;
    int * pDists, i;
    pDists = ABC_CALLOC( int, Aig_ManObjNumMax(p) );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManIncrementTravId( p );
    Saig_ManWindowOutline_rec( p, pObj, nDist, vNodes, pDists );
    Vec_PtrSort( vNodes, (int (*)(void))Aig_ObjCompareIdIncrease );
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        assert( Aig_ObjIsTravIdCurrent(p, pObjLi) == 
                Aig_ObjIsTravIdCurrent(p, pObjLo) );
    ABC_FREE( pDists );
    return vNodes;
}